

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O2

int AF_A_InquisitorAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  AActor *pAVar4;
  PClassActor *pPVar5;
  AActor *self;
  char *__assertion;
  double z;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054c224;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_0054c076:
        self = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054c224;
        }
      }
      if (numparam == 1) goto LAB_0054c0f6;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_0054c214;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054c224;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054c214;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054c0f6:
        obj = &self->target;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar4 != (AActor *)0x0) {
          A_FaceTarget(self);
          dVar1 = (self->Angles).Yaw.Degrees;
          z = (self->__Pos).Z + 32.0;
          (self->__Pos).Z = z;
          (self->Angles).Yaw.Degrees = dVar1 + -1.40625;
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
          pPVar5 = PClass::FindActor("InquisitorShot");
          pAVar4 = P_SpawnMissileZAimed(self,z,pAVar4,pPVar5);
          if (pAVar4 != (AActor *)0x0) {
            (pAVar4->Vel).Z = (pAVar4->Vel).Z + 9.0;
          }
          dVar1 = (self->__Pos).Z;
          (self->Angles).Yaw.Degrees = (self->Angles).Yaw.Degrees + 2.8125;
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
          pPVar5 = PClass::FindActor("InquisitorShot");
          pAVar4 = P_SpawnMissileZAimed(self,dVar1,pAVar4,pPVar5);
          if (pAVar4 != (AActor *)0x0) {
            (pAVar4->Vel).Z = (pAVar4->Vel).Z + 16.0;
          }
          (self->__Pos).Z = (self->__Pos).Z + -32.0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054c224;
    }
    if (self == (AActor *)0x0) goto LAB_0054c076;
  }
LAB_0054c214:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054c224:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                ,0x37,"int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_InquisitorAttack)
{
	PARAM_ACTION_PROLOGUE;

	AActor *proj;

	if (self->target == NULL)
		return 0;

	A_FaceTarget (self);

	self->AddZ(32);
	self->Angles.Yaw -= 45./32;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 9;
	}
	self->Angles.Yaw += 45./16;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 16;
	}
	self->AddZ(-32);
	return 0;
}